

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall
Memory::Recycler::AutoSetupRecyclerForNonCollectingMark::DoCommonSetup
          (AutoSetupRecyclerForNonCollectingMark *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  Recycler *pRVar4;
  undefined8 *in_FS_OFFSET;
  
  pRVar4 = this->m_recycler;
  if (((pRVar4->collectionState).value & ~CollectionStateExit) != CollectionStateNotCollecting) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1f04,
                       "(m_recycler.collectionState == CollectionStateNotCollecting || m_recycler.collectionState == CollectionStateExit)"
                       ,
                       "m_recycler.collectionState == CollectionStateNotCollecting || m_recycler.collectionState == CollectionStateExit"
                      );
    if (!bVar3) goto LAB_0027490d;
    *puVar1 = 0;
    pRVar4 = this->m_recycler;
  }
  bVar3 = DoQueueTrackedObject(pRVar4);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1f06,"(!m_recycler.DoQueueTrackedObject())",
                       "!m_recycler.DoQueueTrackedObject()");
    if (!bVar3) {
LAB_0027490d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  pRVar4 = this->m_recycler;
  if (pRVar4->inPartialCollectMode == true) {
    Recycler::FinishPartialCollect(pRVar4,(RecyclerSweepManager *)0x0);
    pRVar4 = this->m_recycler;
  }
  this->m_previousCollectionState = (pRVar4->collectionState).value;
  memcpy(&this->m_previousCollectionStats,&pRVar4->collectionStats,0x538);
  memset(&pRVar4->collectionStats,0,0x538);
  this->m_setupDone = true;
  return;
}

Assistant:

void Recycler::AutoSetupRecyclerForNonCollectingMark::DoCommonSetup()
{
    Assert(m_recycler.collectionState == CollectionStateNotCollecting || m_recycler.collectionState == CollectionStateExit);
#if ENABLE_CONCURRENT_GC
    Assert(!m_recycler.DoQueueTrackedObject());
#endif
#if ENABLE_PARTIAL_GC
    // We need to get out of partial collect before we do the mark because we
    // will mess with the free bit vector state
    // GC-CONSIDER: don't mess with the free bit vector?
    if (m_recycler.inPartialCollectMode)
    {
        m_recycler.FinishPartialCollect();
    }
#endif
    m_previousCollectionState = m_recycler.collectionState;
#ifdef RECYCLER_STATS
    m_previousCollectionStats = m_recycler.collectionStats;
    memset(&m_recycler.collectionStats, 0, sizeof(RecyclerCollectionStats));
#endif
    m_setupDone = true;
}